

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

void __thiscall
slang::ast::ProceduralCheckerStatement::serializeTo
          (ProceduralCheckerStatement *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *in_RSI;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *in_RDI;
  Symbol *inst;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *__range2;
  Symbol *in_stack_00000098;
  ASTSerializer *in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *in_stack_ffffffffffffff98;
  ASTSerializer *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
  local_30;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *local_28;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
             (char *)in_RDI);
  name._M_str = in_stack_ffffffffffffffc0;
  name._M_len = in_stack_ffffffffffffffb8;
  ASTSerializer::startArray(in_stack_ffffffffffffffb0,name);
  local_28 = in_RDI + 2;
  local_30._M_current =
       (Symbol **)
       std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff98);
  std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                        *)in_RSI,
                       (__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
    ::operator*(&local_30);
    ASTSerializer::startObject((ASTSerializer *)0xa5bcd6);
    in_stack_ffffffffffffff98 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
               (char *)in_RDI);
    ASTSerializer::writeLink(in_stack_000000a0,(string_view)in_stack_000000a8,in_stack_00000098);
    ASTSerializer::endObject((ASTSerializer *)0xa5bd12);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  ASTSerializer::endArray((ASTSerializer *)0xa5bd28);
  return;
}

Assistant:

void ProceduralCheckerStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("instances");
    for (auto inst : instances) {
        serializer.startObject();
        serializer.writeLink("instance", *inst);
        serializer.endObject();
    }
    serializer.endArray();
}